

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRefCount.cpp
# Opt level: O2

void testRefCount(void)

{
  usize *puVar1;
  code *pcVar2;
  int iVar3;
  Object *pOVar4;
  Ptr<TestObject> ptr;
  Ptr<TestObject> ptr2;
  Ptr<TestObject> ptr_1;
  
  ptr.refObj = (Object *)operator_new(0x10);
  (ptr.refObj)->ref = 0;
  (ptr.refObj)->_vptr_Object = (_func_int **)&PTR__TestObject_0010ad78;
  testRefCount::count = testRefCount::count + 1;
  LOCK();
  (ptr.refObj)->ref = (ptr.refObj)->ref + 1;
  UNLOCK();
  ptr.obj = (TestObject *)ptr.refObj;
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x13,"count == 1");
    if (iVar3 != 0) goto LAB_001027b4;
  }
  RefCount::Ptr<TestObject>::~Ptr(&ptr);
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x15,"count == 0");
    if (iVar3 != 0) goto LAB_001027b4;
  }
  ptr.refObj = (Object *)0x0;
  ptr.obj = (TestObject *)0x0;
  pOVar4 = (Object *)operator_new(0x10);
  pOVar4->ref = 0;
  ((Object *)&pOVar4->_vptr_Object)->_vptr_Object = (_func_int **)&PTR__TestObject_0010ad78;
  testRefCount::count = testRefCount::count + 1;
  LOCK();
  pOVar4->ref = pOVar4->ref + 1;
  UNLOCK();
  ptr_1.refObj = pOVar4;
  ptr_1.obj = (TestObject *)pOVar4;
  if (pOVar4 == &(ptr.obj)->super_Object) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x1b,"ptr != ptr3");
    if (iVar3 != 0) goto LAB_001027b4;
  }
  ptr2.refObj = ptr_1.refObj;
  ptr2.obj = (TestObject *)pOVar4;
  if (ptr_1.refObj != (Object *)0x0) {
    LOCK();
    (ptr_1.refObj)->ref = (ptr_1.refObj)->ref + 1;
    UNLOCK();
    if (&(ptr_1.obj)->super_Object != pOVar4) {
      iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                            ,0x1d,"ptr == ptr2");
      if (iVar3 != 0) goto LAB_001027b4;
    }
    if (ptr2.refObj != (Object *)0x0) {
      LOCK();
      (ptr2.refObj)->ref = (ptr2.refObj)->ref + 1;
      UNLOCK();
    }
  }
  if (ptr.refObj != (Object *)0x0) {
    LOCK();
    puVar1 = &(ptr.refObj)->ref;
    *puVar1 = *puVar1 - 1;
    UNLOCK();
    if ((*puVar1 == 0) && (ptr.refObj != (Object *)0x0)) {
      (*(ptr.refObj)->_vptr_Object[1])();
    }
  }
  ptr.refObj = ptr2.refObj;
  ptr.obj = ptr2.obj;
  if (ptr_1.obj != ptr2.obj) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x1f,"ptr == ptr3");
    if (iVar3 != 0) goto LAB_001027b4;
  }
  if (testRefCount::count != 1) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x20,"count == 1");
    if (iVar3 != 0) goto LAB_001027b4;
  }
  RefCount::Ptr<TestObject>::~Ptr(&ptr2);
  RefCount::Ptr<TestObject>::~Ptr(&ptr_1);
  RefCount::Ptr<TestObject>::~Ptr(&ptr);
  if (testRefCount::count != 0) {
    iVar3 = Debug::printf("%s:%u: assertion failed: %s\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/test/UnitTest/TestRefCount.cpp"
                          ,0x22,"count == 0");
    if (iVar3 != 0) {
LAB_001027b4:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  return;
}

Assistant:

void testRefCount()
{
  static int count = 0;

  class TestObject : public RefCount::Object
  {
  public:
    TestObject() {++count;}
    ~TestObject() {--count;}
  };

  // test construction and destruction
  {
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

  // test copy constructor
  {
    RefCount::Ptr<TestObject> ptr3;
    RefCount::Ptr<TestObject> ptr = new TestObject;
    ASSERT(ptr != ptr3);
    RefCount::Ptr<TestObject> ptr2(ptr);
    ASSERT(ptr == ptr2);
    ptr3 = ptr2;
    ASSERT(ptr == ptr3);
    ASSERT(count == 1);
  }
  ASSERT(count == 0);

}